

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-definition-parse.c
# Opt level: O0

int cd_match_data_init(parser_info *info,char **attr)

{
  char *pcVar1;
  int iVar2;
  coda_detection_rule_entry *pcVar3;
  char *local_40;
  char *string_value;
  coda_expression *expr;
  char *path;
  char *offset_string;
  char **attr_local;
  parser_info *info_local;
  
  info->node->free_data = coda_detection_rule_entry_delete;
  offset_string = (char *)attr;
  attr_local = (char **)info;
  path = get_attribute_value(attr,"offset");
  expr = (coda_expression *)get_attribute_value((char **)offset_string,"path");
  if (expr == (coda_expression *)0x0) {
    pcVar3 = coda_detection_rule_entry_new((char *)0x0);
    *(coda_detection_rule_entry **)(*attr_local + 8) = pcVar3;
    if (*(long *)(*attr_local + 8) == 0) {
      return -1;
    }
  }
  if (path == (char *)0x0) {
    if (expr != (coda_expression *)0x0) {
      iVar2 = add_detection_rule_entry_for_path
                        (*(coda_detection_rule **)(*(long *)(*attr_local + 0x2f8) + 8),(char *)expr,
                         &local_40);
      if (iVar2 != 0) {
        return -1;
      }
      pcVar3 = coda_detection_rule_entry_new(local_40);
      *(coda_detection_rule_entry **)(*attr_local + 8) = pcVar3;
      free(local_40);
      if (*(long *)(*attr_local + 8) == 0) {
        return -1;
      }
    }
  }
  else {
    if (expr != (coda_expression *)0x0) {
      coda_set_error(-400,"providing both \'path\' and \'offset\' attributes is not allowed");
      return -1;
    }
    local_40 = strdup(path);
    if (local_40 == (char *)0x0) {
      coda_set_error(-1,"out of memory (could not duplicate string) (%s:%u)",
                     "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-definition-parse.c"
                     ,0x9a0);
      return -1;
    }
    string_value = (char *)coda_expression_new(expr_constant_integer,local_40,(coda_expression *)0x0
                                               ,(coda_expression *)0x0,(coda_expression *)0x0,
                                               (coda_expression *)0x0);
    if ((coda_expression *)string_value == (coda_expression *)0x0) {
      coda_set_error(-400,"invalid \'offset\' attribute value \'%s\'",path);
      return -1;
    }
    iVar2 = coda_detection_rule_entry_set_expression
                      (*(coda_detection_rule_entry **)(*attr_local + 8),
                       (coda_expression *)string_value);
    if (iVar2 != 0) {
      coda_expression_delete((coda_expression *)string_value);
      return -1;
    }
  }
  pcVar1 = *attr_local;
  pcVar1[0x28] = '\x01';
  pcVar1[0x29] = '\0';
  pcVar1[0x2a] = '\0';
  pcVar1[0x2b] = '\0';
  *(code **)(*attr_local + 0x30) = cd_match_data_finalise;
  return 0;
}

Assistant:

static int cd_match_data_init(parser_info *info, const char **attr)
{
    const char *offset_string;
    const char *path;
    coda_expression *expr;
    char *string_value;

    info->node->free_data = (free_data_handler)coda_detection_rule_entry_delete;

    offset_string = get_attribute_value(attr, "offset");
    path = get_attribute_value(attr, "path");

    if (path == NULL)
    {
        info->node->data = coda_detection_rule_entry_new(NULL);
        if (info->node->data == NULL)
        {
            return -1;
        }
    }
    if (offset_string != NULL)
    {
        if (path != NULL)
        {
            coda_set_error(CODA_ERROR_DATA_DEFINITION, "providing both 'path' and 'offset' attributes is not allowed");
            return -1;
        }
        string_value = strdup(offset_string);
        if (string_value == NULL)
        {
            coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not duplicate string) (%s:%u)", __FILE__,
                           __LINE__);
            return -1;
        }
        expr = coda_expression_new(expr_constant_integer, string_value, NULL, NULL, NULL, NULL);
        if (expr == NULL)
        {
            coda_set_error(CODA_ERROR_DATA_DEFINITION, "invalid 'offset' attribute value '%s'", offset_string);
            return -1;
        }
        if (coda_detection_rule_entry_set_expression((coda_detection_rule_entry *)info->node->data, expr) != 0)
        {
            coda_expression_delete(expr);
            return -1;
        }
    }
    else if (path != NULL)
    {
        if (add_detection_rule_entry_for_path((coda_detection_rule *)info->node->parent->data, path, &string_value) !=
            0)
        {
            return -1;
        }
        info->node->data = coda_detection_rule_entry_new(string_value);
        free(string_value);
        if (info->node->data == NULL)
        {
            return -1;
        }
    }

    info->node->expect_char_data = 1;
    info->node->finalise_element = cd_match_data_finalise;

    return 0;
}